

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

void duckdb_je_psset_insert(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  
  ps->h_in_psset = true;
  psset_stats_insert(psset,ps);
  if (ps->h_alloc_allowed == true) {
    psset_alloc_container_insert(psset,ps);
  }
  psset_maybe_insert_purge_list(psset,ps);
  if (ps->h_hugify_allowed == true) {
    ps->h_in_psset_hugify_container = true;
    (ps->ql_link_hugify).qre_next = ps;
    (ps->ql_link_hugify).qre_prev = ps;
    phVar1 = (psset->to_hugify).head.qlh_first;
    if (phVar1 != (hpdata_t *)0x0) {
      (ps->ql_link_hugify).qre_next = (phVar1->ql_link_hugify).qre_prev;
      (phVar1->ql_link_hugify).qre_prev = ps;
      phVar2 = (((ps->ql_link_hugify).qre_prev)->ql_link_hugify).qre_next;
      (ps->ql_link_hugify).qre_prev = phVar2;
      (((phVar1->ql_link_hugify).qre_prev)->ql_link_hugify).qre_next = phVar1;
      (phVar2->ql_link_hugify).qre_next = ps;
    }
    (psset->to_hugify).head.qlh_first = (ps->ql_link_hugify).qre_next;
  }
  return;
}

Assistant:

void
psset_insert(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, true);

	psset_stats_insert(psset, ps);
	if (hpdata_alloc_allowed_get(ps)) {
		psset_alloc_container_insert(psset, ps);
	}
	psset_maybe_insert_purge_list(psset, ps);

	if (hpdata_hugify_allowed_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, true);
		hpdata_hugify_list_append(&psset->to_hugify, ps);
	}
}